

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O1

Rect __thiscall lunasvg::Rect::intersected(Rect *this,Rect *rect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Rect RVar6;
  
  if ((rect->w < 0.0) || (rect->h < 0.0)) {
    return *this;
  }
  if ((0.0 <= this->w) && (0.0 <= this->h)) {
    fVar4 = this->x;
    fVar1 = rect->x;
    fVar2 = rect->w + fVar1;
    if (fVar1 <= fVar4) {
      fVar1 = fVar4;
    }
    fVar4 = this->w + fVar4;
    if (fVar4 <= fVar2) {
      fVar2 = fVar4;
    }
    if (fVar1 < fVar2) {
      fVar4 = this->y;
      fVar5 = rect->y;
      fVar3 = rect->h + fVar5;
      if (fVar5 <= fVar4) {
        fVar5 = fVar4;
      }
      fVar4 = this->h + fVar4;
      if (fVar4 <= fVar3) {
        fVar3 = fVar4;
      }
      if (fVar5 < fVar3) {
        RVar6.w = fVar2 - fVar1;
        RVar6.h = fVar3 - fVar5;
        RVar6.y = fVar5;
        RVar6.x = fVar1;
        return RVar6;
      }
    }
    return (Rect)ZEXT816(0);
  }
  return *rect;
}

Assistant:

constexpr bool isValid() const { return w >= 0.f && h >= 0.f; }